

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dae.cpp
# Opt level: O2

void __thiscall opencollada::Dae::readFile(Dae *this,string *path)

{
  bool bVar1;
  XmlNodeSet *pXVar2;
  size_t sVar3;
  _Base_ptr p_Var4;
  istream *piVar5;
  iterator iVar6;
  string buffer;
  XmlNode instance;
  XmlAttribute url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  size_t local_528;
  XmlNode local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Uri::FromNativePath((Uri *)&ss,path);
  Uri::operator=(&this->mUri,(Uri *)&ss);
  Uri::~Uri((Uri *)&ss);
  XmlDoc::readFile(&this->super_XmlDoc,path);
  bVar1 = XmlDoc::operator_cast_to_bool(&this->super_XmlDoc);
  if (bVar1) {
    local_520 = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_animation_abi_cxx11_);
    ::std::operator+(&local_350,&local_50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_330,&local_350,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_camera_abi_cxx11_);
    ::std::operator+(&local_310,&local_330,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_2f0,&local_310,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_controller_abi_cxx11_);
    ::std::operator+(&local_2d0,&local_2f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_2b0,&local_2d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_effect_abi_cxx11_);
    ::std::operator+(&local_290,&local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_270,&local_290,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_force_field_abi_cxx11_);
    ::std::operator+(&local_250,&local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_230,&local_250,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_formula_abi_cxx11_);
    ::std::operator+(&local_210,&local_230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_1f0,&local_210,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_geometry_abi_cxx11_);
    ::std::operator+(&local_1d0,&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_1b0,&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_image_abi_cxx11_);
    ::std::operator+(&local_190,&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_170,&local_190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_joint_abi_cxx11_);
    ::std::operator+(&local_150,&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_130,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_kinematics_model_abi_cxx11_);
    ::std::operator+(&local_110,&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_f0,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_kinematics_scene_abi_cxx11_);
    ::std::operator+(&local_d0,&local_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_b0,&local_d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_light_abi_cxx11_);
    ::std::operator+(&local_90,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_70,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_node_abi_cxx11_);
    ::std::operator+(&local_4f8,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_518,&local_4f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_physics_material_abi_cxx11_);
    ::std::operator+(&local_548,&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     &local_548,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_physics_model_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_physics_scene_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::instance_visual_scene_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes(&local_520,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    ::std::__cxx11::string::~string((string *)&instance);
    ::std::__cxx11::string::~string((string *)&url);
    ::std::__cxx11::string::~string((string *)&local_548);
    ::std::__cxx11::string::~string((string *)&local_518);
    ::std::__cxx11::string::~string((string *)&local_4f8);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_190);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_210);
    ::std::__cxx11::string::~string((string *)&local_230);
    ::std::__cxx11::string::~string((string *)&local_250);
    ::std::__cxx11::string::~string((string *)&local_270);
    ::std::__cxx11::string::~string((string *)&local_290);
    ::std::__cxx11::string::~string((string *)&local_2b0);
    ::std::__cxx11::string::~string((string *)&local_2d0);
    ::std::__cxx11::string::~string((string *)&local_2f0);
    ::std::__cxx11::string::~string((string *)&local_310);
    ::std::__cxx11::string::~string((string *)&local_330);
    ::std::__cxx11::string::~string((string *)&local_350);
    ::std::__cxx11::string::~string((string *)&local_50);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::url_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_node_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::proxy_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    local_548._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::accessor_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::skin_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::morph_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes((XmlNode *)&local_548,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    ::std::__cxx11::string::~string((string *)&instance);
    ::std::__cxx11::string::~string((string *)&url);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::source_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::render_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      ::std::__cxx11::string::string((string *)&ss,"camera_node",(allocator *)&local_548);
      url = XmlNode::attribute(&instance,(string *)&ss);
      ::std::__cxx11::string::~string((string *)&ss);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        local_528 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,local_528,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::skeleton_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      sVar3 = XmlNode::line(&instance);
      XmlNode::text_abi_cxx11_((string *)&ss,&instance);
      onAnyDAEURI(this,sVar3,(string *)&ss);
      ::std::__cxx11::string::~string((string *)&ss);
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    instance = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_material_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::instance_rigid_body_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes(&instance,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::target_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::instance_physics_model_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::parent_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::convex_mesh_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::convex_hull_of_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyDAEURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    for (p_Var4 = (this->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->mExternalDAEs)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)::std::_Rb_tree_increment(p_Var4)) {
      Uri::nativePath_abi_cxx11_((string *)&ss,(Uri *)(p_Var4 + 1));
      XmlDoc::readFile((XmlDoc *)&p_Var4[7]._M_parent,(string *)&ss);
      ::std::__cxx11::string::~string((string *)&ss);
    }
    instance = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::image_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_child_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::init_from_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes(&instance,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      sVar3 = XmlNode::line(&instance);
      XmlNode::text_abi_cxx11_((string *)&ss,&instance);
      onAnyURI(this,sVar3,(string *)&ss);
      ::std::__cxx11::string::~string((string *)&ss);
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    local_4f8._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::binary_abi_cxx11_);
    ::std::operator+(&local_548,&local_518,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_child_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     &local_548,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::ref_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&url,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&instance,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::init_from_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_child_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::ref_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes((XmlNode *)&local_4f8,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    ::std::__cxx11::string::~string((string *)&instance);
    ::std::__cxx11::string::~string((string *)&url);
    ::std::__cxx11::string::~string((string *)&local_548);
    ::std::__cxx11::string::~string((string *)&local_518);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      sVar3 = XmlNode::line(&instance);
      XmlNode::text_abi_cxx11_((string *)&ss,&instance);
      onAnyURI(this,sVar3,(string *)&ss);
      ::std::__cxx11::string::~string((string *)&ss);
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    instance = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::include_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::profile_BRIDGE_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes(&instance,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::url_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    instance = XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+(&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::channel_abi_cxx11_);
    ::std::operator+(&buffer,&local_568,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_or_all_abi_cxx11_);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     &buffer,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             Strings::input_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes(&instance,(string *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    ::std::__cxx11::string::~string((string *)&buffer);
    ::std::__cxx11::string::~string((string *)&local_568);
    iVar6 = XmlNodeSet::begin(pXVar2);
    buffer._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    buffer._M_string_length = CONCAT44(buffer._M_string_length._4_4_,iVar6.mIndex);
    iVar6 = XmlNodeSet::end(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&buffer,(iterator *)&local_568);
      if (!bVar1) break;
      instance = XmlNodeSet::iterator::operator*((iterator *)&buffer);
      url = XmlNode::attribute(&instance,(string *)Strings::source_abi_cxx11_);
      bVar1 = XmlAttribute::operator_cast_to_bool(&url);
      if (bVar1) {
        sVar3 = XmlNode::line(&instance);
        XmlAttribute::value_abi_cxx11_((string *)&ss,&url);
        onAnyURI(this,sVar3,(string *)&ss);
        ::std::__cxx11::string::~string((string *)&ss);
      }
      XmlNodeSet::iterator::operator++((iterator *)&buffer);
    }
    buffer._M_dataplus._M_p = (pointer)XmlDoc::root(&this->super_XmlDoc);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     xpath_all_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     Strings::IDREF_array_abi_cxx11_);
    pXVar2 = XmlNode::selectNodes
                       ((XmlNode *)&buffer,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss);
    ::std::__cxx11::string::~string((string *)&ss);
    iVar6 = XmlNodeSet::begin(pXVar2);
    local_568._M_dataplus._M_p = (pointer)iVar6.mNodeSet;
    local_568._M_string_length._0_4_ = iVar6.mIndex;
    iVar6 = XmlNodeSet::end(pXVar2);
    instance.mNode = (xmlNodePtr)iVar6.mNodeSet;
    while( true ) {
      bVar1 = XmlNodeSet::iterator::operator!=((iterator *)&local_568,(iterator *)&instance);
      if (!bVar1) break;
      url.mAttr = (xmlAttrPtr)XmlNodeSet::iterator::operator*((iterator *)&local_568);
      XmlNode::text_abi_cxx11_(&buffer,(XmlNode *)&url);
      ::std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&buffer,_S_out|_S_in)
      ;
      ::std::__cxx11::string::~string((string *)&buffer);
      buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
      buffer._M_string_length = 0;
      buffer.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar5 = ::std::operator>>((istream *)&ss,(string *)&buffer);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        local_548._M_dataplus._M_p = (pointer)XmlNode::line((XmlNode *)&url);
        ::std::
        vector<std::tuple<unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string>>>
        ::emplace_back<unsigned_long,std::__cxx11::string&>
                  ((vector<std::tuple<unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<unsigned_long,std::__cxx11::string>>>
                    *)&this->mIDREFs,(unsigned_long *)&local_548,&buffer);
      }
      ::std::__cxx11::string::~string((string *)&buffer);
      ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      XmlNodeSet::iterator::operator++((iterator *)&local_568);
    }
  }
  return;
}

Assistant:

void Dae::readFile(const string & path)
	{
		mUri = Uri::FromNativePath(path);

		Super::readFile(path);

		if (!*this)
			return;

		// List referenced DAEs

		// InstanceWithExtra and other <instance_*> with "url" attribute
		const auto & instances = root().selectNodes(
			xpath_all + Strings::instance_animation +
			xpath_or_all + Strings::instance_camera +
			xpath_or_all + Strings::instance_controller +
			xpath_or_all + Strings::instance_effect +
			xpath_or_all + Strings::instance_force_field +
			xpath_or_all + Strings::instance_formula +
			xpath_or_all + Strings::instance_geometry +
			xpath_or_all + Strings::instance_image +
			xpath_or_all + Strings::instance_joint +
			xpath_or_all + Strings::instance_kinematics_model +
			xpath_or_all + Strings::instance_kinematics_scene +
			xpath_or_all + Strings::instance_light +
			xpath_or_all + Strings::instance_node +
			xpath_or_all + Strings::instance_physics_material +
			xpath_or_all + Strings::instance_physics_model +
			xpath_or_all + Strings::instance_physics_scene +
			xpath_or_all + Strings::instance_visual_scene
		);
		for (auto instance : instances)
			if (auto url = instance.attribute(Strings::url))
				onAnyDAEURI(instance.line(), url.value());

		// <instance_node>
		const auto & instance_nodes = root().selectNodes(xpath_all + Strings::instance_node);
		for (auto instance_node : instance_nodes)
		{
			if (auto proxy = instance_node.attribute(Strings::proxy))
				onAnyDAEURI(instance_node.line(), proxy.value());
		}

		// <accessor>
		// <skin>
		// <morph>
		const auto & elementsWithSource = root().selectNodes(
			xpath_all + Strings::accessor +
			xpath_or_all + Strings::skin +
			xpath_or_all + Strings::morph
		);
		for (auto element : elementsWithSource)
		{
			if (auto source = element.attribute(Strings::source))
				onAnyDAEURI(element.line(), source.value());
		}

		// <render>
		const auto & renders = root().selectNodes(xpath_all + Strings::render);
		for (auto render : renders)
		{
			if (auto camera_node = render.attribute("camera_node"))
				onAnyDAEURI(render.line(), camera_node.value());
		}

		// <skeleton>
		const auto & skeletons = root().selectNodes(xpath_all + Strings::skeleton);
		for (auto skeleton : skeletons)
		{
			onAnyDAEURI(skeleton.line(), skeleton.text());
		}

		// <instance_material>
		// <instance_rigid_body>
		const auto & elementsWithTarget = root().selectNodes(
			xpath_all + Strings::instance_material +
			xpath_or_all + Strings::instance_rigid_body
		);
		for (auto element : elementsWithTarget)
		{
			if (auto target = element.attribute(Strings::target))
				onAnyDAEURI(element.line(), target.value());
		}

		// <instance_physics_model>
		const auto & instance_physics_models = root().selectNodes(xpath_all + Strings::instance_physics_model);
		for (auto instance_physics_model : instance_physics_models)
		{
			if (auto parent = instance_physics_model.attribute(Strings::parent))
				onAnyDAEURI(instance_physics_model.line(),  parent.value());
		}

		// <convex_mesh>
		const auto & convex_meshes = root().selectNodes(xpath_all + Strings::convex_mesh);
		for (auto convex_mesh : convex_meshes)
		{
			if (auto convex_hull_of = convex_mesh.attribute(Strings::convex_hull_of))
				onAnyDAEURI(convex_mesh.line(), convex_hull_of.value());
		}

		// TODO
		// rigid_body attribute is an sid. Make sid check.

		// <ref_attachment>
		// <attachment>
		//auto attachments = root().selectNodes(
		//	xpath_all + Strings::attachment +
		//	xpath_or_all + Strings::ref_attachment
		//);
		//for (auto attachment : attachments)
		//{
		//	if (auto rigid_body = attachment.attribute(Strings::rigid_body))
		//		onAnyDAEURI(attachment.line(), rigid_body.value());
		//}

		// Load found DAE references
		for (auto & uri_dae : mExternalDAEs)
			uri_dae.second.readExternalFile(uri_dae.first.nativePath());

		// Look for additional xs:anyURI that are not DAE references:

		// <image>/<init_from>
		const auto & init_froms = root().selectNodes(xpath_all + Strings::image + xpath_child + Strings::init_from);
		for (auto init_from : init_froms)
		{
			onAnyURI(init_from.line(), init_from.text());
		}

		// <binary>/<ref>
		// <init_from>/<ref>
		const auto & refs = root().selectNodes(
			xpath_all + Strings::binary + xpath_child + Strings::ref +
			xpath_or_all + Strings::init_from + xpath_child + Strings::ref
		);
		for (auto ref : refs)
		{
			onAnyURI(ref.line(), ref.text());
		}

		// <include>
		// <profile_BRIDGE>
		const auto & elementsWithUrl = root().selectNodes(
			xpath_all + Strings::include +
			xpath_or_all + Strings::profile_BRIDGE
		);
		for (auto element : elementsWithUrl)
		{
			if (auto url = element.attribute(Strings::url))
				onAnyURI(element.line(), url.value());
		}

		// Ignore these anyURI:
		// <COLLADA>@base
		// <contributor>/<author_website>
		// <contributor>/<source_data>

		// Look for URI fragments:

		// <channel>
		// <input>
		const auto & elementsWithSourceFragment = root().selectNodes(
			xpath_all + Strings::channel +
			xpath_or_all + Strings::input
		);
		for (auto element : elementsWithSourceFragment)
		{
			if (auto source = element.attribute(Strings::source))
				//onURIFragment(element.line(), source.value());
				onAnyURI(element.line(), source.value());
		}

		// Look for IDREFs

		// <IDREF_array>
		const auto & IDREF_arrays = root().selectNodes(xpath_all + Strings::IDREF_array);
		for (auto IDREF_array : IDREF_arrays)
		{
			stringstream ss(IDREF_array.text());
			string buffer;
			while (ss >> buffer)
				mIDREFs.emplace_back(IDREF_array.line(), buffer);
		}
	}